

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall cmake::GetDevWarningsAsErrors(cmake *this,cmMakefile *mf)

{
  cmState *this_00;
  cmMakefile *this_01;
  bool bVar1;
  char *val;
  bool local_101;
  byte local_ca;
  allocator local_a9;
  string local_a8;
  char *local_88;
  char *cacheEntryValue;
  string local_78;
  allocator local_41;
  string local_40;
  cmMakefile *local_20;
  cmMakefile *mf_local;
  cmake *this_local;
  
  local_20 = mf;
  mf_local = (cmMakefile *)this;
  if (mf == (cmMakefile *)0x0) {
    this_00 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a8,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_a9);
    val = cmState::GetCacheEntryValue(this_00,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    local_101 = false;
    if (val != (char *)0x0) {
      local_88 = val;
      local_101 = cmSystemTools::IsOff(val);
    }
    this_local._7_1_ = local_101;
  }
  else {
    std::allocator<char>::allocator();
    cacheEntryValue._6_1_ = 0;
    cacheEntryValue._5_1_ = 0;
    std::__cxx11::string::string((string *)&local_40,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_41);
    bVar1 = cmMakefile::IsSet(mf,&local_40);
    this_01 = local_20;
    local_ca = 0;
    if (bVar1) {
      std::allocator<char>::allocator();
      cacheEntryValue._6_1_ = 1;
      std::__cxx11::string::string
                ((string *)&local_78,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",
                 (allocator *)((long)&cacheEntryValue + 7));
      cacheEntryValue._5_1_ = 1;
      bVar1 = cmMakefile::IsOn(this_01,&local_78);
      local_ca = bVar1 ^ 0xff;
    }
    this_local._7_1_ = local_ca & 1;
    if ((cacheEntryValue._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_78);
    }
    if ((cacheEntryValue._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&cacheEntryValue + 7));
    }
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmake::GetDevWarningsAsErrors(cmMakefile const* mf)
{
  if (mf)
    {
    return (mf->IsSet("CMAKE_SUPPRESS_DEVELOPER_ERRORS") &&
            !mf->IsOn("CMAKE_SUPPRESS_DEVELOPER_ERRORS"));
    }
  else
    {
    const char* cacheEntryValue = this->State->GetCacheEntryValue(
      "CMAKE_SUPPRESS_DEVELOPER_ERRORS");
    return cacheEntryValue && cmSystemTools::IsOff(cacheEntryValue);
    }
}